

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  hasher *hf;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  key_type *in_stack_fffffffffffffae8;
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaf0;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaf8;
  allocator_type *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  uint i_00;
  char *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  Type TVar2;
  Hasher *this_00;
  AssertHelper *in_stack_fffffffffffffb20;
  Hasher *this_01;
  char *in_stack_fffffffffffffb30;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb38;
  Message *in_stack_fffffffffffffb68;
  AssertionResult local_460 [6];
  string local_3f8 [32];
  value_type *in_stack_fffffffffffffc28;
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc30;
  AssertionResult local_3c0;
  string local_3b0 [36];
  int local_38c;
  size_type local_378;
  AssertionResult local_370 [6];
  string local_308 [36];
  int local_2e4;
  size_type local_2d0;
  AssertionResult local_2c8;
  string local_2b8 [32];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_298;
  Hasher local_288;
  Hasher local_27c [18];
  int local_1a0;
  int local_19c;
  AssertionResult local_198 [6];
  string local_130 [32];
  string local_110 [32];
  int local_f0;
  int local_ec;
  size_type local_d8;
  AssertionResult local_d0 [6];
  Message local_68 [4];
  int local_48;
  string local_38 [32];
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffaf0,(float)((ulong)in_stack_fffffffffffffae8 >> 0x20),
             SUB84(in_stack_fffffffffffffae8,0));
  HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_38);
  for (local_48 = 0; local_48 < 0x333; local_48 = local_48 + 1) {
    in_stack_fffffffffffffb68 = local_68;
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::__cxx11::string::~string((string *)local_68);
  }
  local_d8 = google::
             BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x102680a);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (char *)in_stack_fffffffffffffb00,(unsigned_long *)in_stack_fffffffffffffaf8,
             (unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1026871);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,(Type)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,(char *)in_stack_fffffffffffffb00
              );
    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0x10268ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102693f);
  local_ec = google::
             BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             ::num_table_copies((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)0x1026950);
  for (local_f0 = 0; TVar2 = (Type)((ulong)in_stack_fffffffffffffb18 >> 0x20), local_f0 < 0x400;
      local_f0 = local_f0 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::__cxx11::string::~string(local_110);
    in_stack_fffffffffffffb38 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)(in_RDI + 2);
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_130);
  }
  local_19c = google::
              BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::num_table_copies((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0x1026a92);
  local_1a0 = local_ec + 2;
  testing::internal::CmpHelperLT<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (char *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8,
             (int *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    in_stack_fffffffffffffb30 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1026b09);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,TVar2,in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
               (char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0x1026b66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1026bd7);
  this_00 = local_27c;
  i_00 = 0;
  Hasher::Hasher(this_00,0);
  this_01 = &local_288;
  Hasher::Hasher(this_01,i_00);
  hf = (hasher *)(ulong)i_00;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_298,i_00,(int *)hf);
  google::
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_01,(size_type)this_00,hf,(key_equal *)CONCAT44(i_00,in_stack_fffffffffffffb08),
             in_stack_fffffffffffffb00);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_298);
  HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_2b8);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffaf0,(float)((ulong)in_stack_fffffffffffffae8 >> 0x20),
             SUB84(in_stack_fffffffffffffae8,0));
  local_2d0 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1026cb9);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((char *)CONCAT44(i_00,in_stack_fffffffffffffb08),(char *)in_stack_fffffffffffffb00,
             (unsigned_long *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffb00 =
         (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x1026d99);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)this_00 >> 0x20),(char *)hf,i_00,
               (char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0x1026df6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1026e67);
  for (local_2e4 = 0; local_2e4 < 0x333; local_2e4 = local_2e4 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_308);
  }
  local_378 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1026f27);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(i_00,in_stack_fffffffffffffb08),(char *)in_stack_fffffffffffffb00,
             (unsigned_long *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffaf8 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x1026f90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)this_00 >> 0x20),(char *)hf,i_00,
               (char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0x1026fed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x102705e);
  for (local_38c = 0; TVar2 = (Type)((ulong)this_00 >> 0x20), local_38c < 0x333;
      local_38c = local_38c + 1) {
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::__cxx11::string::~string(local_3b0);
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0x10270cb);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)CONCAT44(i_00,in_stack_fffffffffffffb08),(char *)in_stack_fffffffffffffb00,
               (unsigned_long *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      in_stack_fffffffffffffaf0 =
           (BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x102716c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,(Type)((ulong)this_00 >> 0x20),(char *)hf,i_00,
                 (char *)in_stack_fffffffffffffb00);
      testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffb68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
      testing::Message::~Message((Message *)0x10271c9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1027234);
  }
  HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_3f8);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x10272b1);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((char *)CONCAT44(i_00,in_stack_fffffffffffffb08),(char *)in_stack_fffffffffffffb00,
             (unsigned_long *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0x1027340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,TVar2,(char *)hf,i_00,(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0x102739b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1027406);
  google::
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0x1027413);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}